

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errno.c
# Opt level: O0

int main(void)

{
  int *piVar1;
  
  piVar1 = __errno_location();
  *piVar1 = 0;
  piVar1 = __errno_location();
  if (*piVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/errno.c, line %d - %s\n"
           ,0x2f,"errno == 0");
  }
  piVar1 = __errno_location();
  *piVar1 = 0x21;
  piVar1 = __errno_location();
  if (*piVar1 != 0x21) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/errno.c, line %d - %s\n"
           ,0x31,"errno == EDOM");
  }
  piVar1 = __errno_location();
  *piVar1 = 0x22;
  piVar1 = __errno_location();
  if (*piVar1 != 0x22) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/errno.c, line %d - %s\n"
           ,0x33,"errno == ERANGE");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    errno = 0;
    TESTCASE( errno == 0 );
    errno = EDOM;
    TESTCASE( errno == EDOM );
    errno = ERANGE;
    TESTCASE( errno == ERANGE );

#if ! defined( REGTEST ) && __STDC_VERSION__ >= 201112L && ! defined( __STDC_NO_THREADS__ )
    {
        thrd_t t;
        struct timespec spec = { 1, 0 };
        int rc;

        TESTCASE( thrd_create( &t, thread_func, NULL ) == thrd_success );

        TESTCASE( thrd_sleep( &spec, NULL ) == 0 );
        TESTCASE( errno == ERANGE );
        TESTCASE( thrd_join( t, &rc ) == thrd_success );
        TESTCASE( rc == 0 );
    }
#endif

    return TEST_RESULTS;
}